

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O3

ExtractScriptData *
cfd::js::api::TransactionStructApiBase::ExtractLockingScript
          (ExtractScriptData *__return_storage_ptr__,Script *locking_script)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this;
  char cVar1;
  WitnessVersion WVar2;
  ScriptOperator *pSVar3;
  int64_t iVar4;
  LockingScriptType LVar5;
  long lVar6;
  ByteData program;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elems;
  string script_type;
  ByteData local_80;
  long local_68;
  long local_60;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this = &__return_storage_ptr__->pushed_datas;
  (__return_storage_ptr__->pushed_datas).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pushed_datas).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pushed_datas).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->witness_version = kVersionNone;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  cfd::core::Script::GetElementList();
  if (local_60 - local_68 == 0x60) {
    pSVar3 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
    cVar1 = cfd::core::ScriptOperator::operator==
                      (pSVar3,(ScriptOperator *)&core::ScriptOperator::OP_TRUE);
    if (cVar1 != '\0') {
      __return_storage_ptr__->script_type = kTrue;
      goto LAB_007816ed;
    }
  }
  cVar1 = cfd::core::Script::IsEmpty();
  if (cVar1 != '\0') {
    __return_storage_ptr__->script_type = kFee;
    goto LAB_007816ed;
  }
  cVar1 = cfd::core::Script::IsP2shScript();
  if (cVar1 == '\0') {
    cVar1 = cfd::core::Script::IsWitnessProgram();
    if (cVar1 == '\0') {
      if (local_60 != local_68) {
        pSVar3 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
        cVar1 = cfd::core::ScriptOperator::operator==
                          (pSVar3,(ScriptOperator *)&core::ScriptOperator::OP_RETURN);
        if (cVar1 != '\0') {
          __return_storage_ptr__->script_type = kNullData;
          goto LAB_007816ed;
        }
      }
      cVar1 = cfd::core::Script::IsP2pkScript();
      if (cVar1 == '\0') {
        cVar1 = cfd::core::Script::IsP2pkhScript();
        if (cVar1 == '\0') {
          cVar1 = cfd::core::Script::IsMultisigScript();
          if (cVar1 == '\0') {
            __return_storage_ptr__->script_type = kNonStandard;
          }
          else {
            __return_storage_ptr__->script_type = kMultisig;
            iVar4 = cfd::core::ScriptElement::GetNumber();
            __return_storage_ptr__->req_sigs = iVar4;
            lVar6 = local_68 + 0x60;
            if (lVar6 != local_60 + -0xc0) {
              do {
                cfd::core::ScriptElement::GetBinaryData();
                std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                          (this,&local_80);
                if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_80.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                lVar6 = lVar6 + 0x60;
              } while (lVar6 != local_60 + -0xc0);
            }
          }
          goto LAB_007816ed;
        }
        __return_storage_ptr__->script_type = kPayToPubkeyHash;
        cfd::core::ScriptElement::GetBinaryData();
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(this,&local_80);
      }
      else {
        __return_storage_ptr__->script_type = kPayToPubkey;
        cfd::core::ScriptElement::GetBinaryData();
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(this,&local_80);
      }
    }
    else {
      WVar2 = cfd::core::ScriptElement::GetNumber();
      cfd::core::ScriptElement::GetBinaryData();
      __return_storage_ptr__->witness_version = WVar2 & 0xff;
      cVar1 = cfd::core::Script::IsP2wpkhScript();
      LVar5 = kWitnessV0KeyHash;
      if (cVar1 == '\0') {
        cVar1 = cfd::core::Script::IsP2wshScript();
        LVar5 = kWitnessV0ScriptHash;
        if (cVar1 == '\0') {
          cVar1 = cfd::core::Script::IsTaprootScript();
          LVar5 = kWitnessV1Taproot;
          if ((cVar1 == '\0') && (LVar5 = kWitnessUnknown, (WVar2 & 0xff) == kVersion0)) {
            __return_storage_ptr__->script_type = kNonStandard;
            __return_storage_ptr__->witness_version = kVersionNone;
            goto LAB_007816de;
          }
        }
      }
      __return_storage_ptr__->script_type = LVar5;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                (this,&local_80);
    }
  }
  else {
    __return_storage_ptr__->script_type = kPayToScriptHash;
    cfd::core::ScriptElement::GetBinaryData();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(this,&local_80);
  }
LAB_007816de:
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_007816ed:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &local_68);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtractScriptData TransactionStructApiBase::ExtractLockingScript(
    Script locking_script) {
  ExtractScriptData extract_data;

  std::string script_type;
  std::vector<ScriptElement> elems = locking_script.GetElementList();
  // FIXME(fujita-cg): judge anycanspent_aremine flag
  if (elems.size() == 1 && elems[0].GetOpCode() == ScriptOperator::OP_TRUE) {
    extract_data.script_type = LockingScriptType::kTrue;
    return extract_data;
  }
#ifndef CFD_DISABLE_ELEMENTS
  if (locking_script.IsEmpty()) {
    // empty
    extract_data.script_type = LockingScriptType::kFee;
    return extract_data;
  }
#endif  // CFD_DISABLE_ELEMENTS
  if (locking_script.IsP2shScript()) {
    // P2shScript
    extract_data.script_type = LockingScriptType::kPayToScriptHash;
    extract_data.pushed_datas.push_back(elems[1].GetBinaryData());
    return extract_data;
  }

  // WitnessData
  if (locking_script.IsWitnessProgram()) {
    uint8_t witness_version = static_cast<uint8_t>(elems[0].GetNumber());
    ByteData program = elems[1].GetBinaryData();
    extract_data.witness_version =
        static_cast<WitnessVersion>(witness_version);
    if (locking_script.IsP2wpkhScript()) {
      // tx witness keyhash
      extract_data.script_type = LockingScriptType::kWitnessV0KeyHash;
      extract_data.pushed_datas.push_back(program);
    } else if (locking_script.IsP2wshScript()) {
      // tx witness scripthash
      extract_data.script_type = LockingScriptType::kWitnessV0ScriptHash;
      extract_data.pushed_datas.push_back(program);
    } else if (locking_script.IsTaprootScript()) {
      extract_data.script_type = LockingScriptType::kWitnessV1Taproot;
      extract_data.pushed_datas.push_back(program);
    } else if (witness_version != 0) {
      // tx witness unknown
      extract_data.script_type = LockingScriptType::kWitnessUnknown;
      extract_data.pushed_datas.push_back(program);
    } else {
      // non standard
      extract_data.script_type = LockingScriptType::kNonStandard;
      extract_data.witness_version = WitnessVersion::kVersionNone;
    }
    return extract_data;
  }

  if (elems.size() >= 1 && elems[0].GetOpCode() == ScriptOperator::OP_RETURN) {
    // tx null data
    extract_data.script_type = LockingScriptType::kNullData;
    return extract_data;
  }
  if (locking_script.IsP2pkScript()) {
    // tx pubkey
    extract_data.script_type = LockingScriptType::kPayToPubkey;
    extract_data.pushed_datas.push_back(elems[0].GetBinaryData());
    return extract_data;
  }
  if (locking_script.IsP2pkhScript()) {
    // tx pubkey hash
    extract_data.script_type = LockingScriptType::kPayToPubkeyHash;
    extract_data.pushed_datas.push_back(elems[2].GetBinaryData());
    return extract_data;
  }
  if (locking_script.IsMultisigScript()) {
    // tx multisig
    extract_data.script_type = LockingScriptType::kMultisig;
    decltype(elems)::const_iterator itr = elems.cbegin();
    extract_data.req_sigs = (*itr).GetNumber();
    ++itr;
    for (; itr != (elems.cend() - 2); ++itr) {
      ByteData pubkey_byte = (*itr).GetBinaryData();
      extract_data.pushed_datas.push_back(pubkey_byte);
    }
    return extract_data;
  }

  // tx nonstandard
  extract_data.script_type = LockingScriptType::kNonStandard;
  return extract_data;
}